

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

int lyv_data_content(lyd_node *node,int options,unres_data *unres)

{
  undefined2 uVar1;
  lys_node *node_00;
  lys_ext_instance **pplVar2;
  int iVar3;
  uint uVar4;
  lys_node *plVar5;
  lyd_node *plVar6;
  lys_node *plVar7;
  lys_ext_instance ***ppplVar8;
  byte bVar9;
  LYS_NODE LVar10;
  LY_DATA_TYPE base_type;
  LY_ECODE LVar11;
  char **ppcVar12;
  lys_module *mod1;
  lyd_node **pplVar13;
  ly_ctx *ctx;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  lyd_node *unaff_R15;
  lys_node *local_68;
  char *local_50;
  lys_type *local_48;
  uint local_34;
  
  plVar5 = (lys_node *)(ulong)(uint)options;
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ad,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  node_00 = node->schema;
  if (node_00 == (lys_node *)0x0) {
    __assert_fail("node->schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ae,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  if (unres == (unres_data *)0x0) {
    __assert_fail("unres",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2af,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  LVar10 = node_00->nodetype;
  plVar6 = node;
  local_34 = options;
  if ((LVar10 & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) {
    do {
      plVar6 = plVar6->parent;
      if (plVar6 == (lyd_node *)0x0) {
        if ((options & 0x50U) != 0) {
          local_34 = options | 0x2000;
        }
        plVar5 = (lys_node *)(ulong)local_34;
        break;
      }
      uVar1 = (undefined2)plVar6->schema->nodetype;
      plVar5 = (lys_node *)(ulong)(ushort)uVar1;
    } while ((uVar1 & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN);
  }
  base_type = (LY_DATA_TYPE)plVar5;
  ctx = node_00->module->ctx;
  bVar9 = node->validity;
  if ((bVar9 & 4) == 0) {
    local_48 = (lys_type *)0x0;
    goto LAB_0011ea21;
  }
  if ((local_34 & 0x2080) == 0) {
    if ((LVar10 == LYS_LIST) && ((local_34 & 6) == 0)) {
      unaff_R15 = (lyd_node *)&node->child;
      for (uVar17 = 0; node_00->padding[2] != uVar17; uVar17 = uVar17 + 1) {
        plVar7 = unaff_R15->schema;
        if ((plVar7 == (lys_node *)0x0) ||
           (plVar5 = (lys_node *)plVar7->name,
           plVar5 != *(lys_node **)(*(long *)&node_00[1].flags + uVar17 * 8))) {
          ly_vlog(ctx,LYE_MISSELEM,LY_VLOG_LYD,node,
                  **(undefined8 **)(*(long *)&node_00[1].flags + uVar17 * 8),node_00->name);
          node = (lyd_node *)plVar7;
          while( true ) {
            if ((lys_node *)node == (lys_node *)0x0) {
              return 1;
            }
            if ((lys_node *)((lys_node *)node)->name ==
                *(lys_node **)(*(long *)&node_00[1].flags + uVar17 * 8)) break;
            node = *(lyd_node **)&((lys_node *)node)->flags;
          }
          ctx = node_00->module->ctx;
          pcVar15 = "Invalid position of the key element.";
          LVar11 = LYE_SPEC;
          goto LAB_0011ecf9;
        }
        unaff_R15 = (lyd_node *)&plVar7->flags;
      }
    }
    if ((LVar10 & (LYS_ANYDATA|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN) {
      for (plVar6 = lyd_first_sibling(node); plVar6 != (lyd_node *)0x0; plVar6 = plVar6->next) {
        if ((plVar6 != node) && (plVar6->schema == node_00)) {
          plVar5 = lys_parent(node_00);
          pcVar15 = node_00->name;
          if (plVar5 == (lys_node *)0x0) {
            pcVar16 = "data tree";
          }
          else {
            pcVar16 = *(char **)(plVar5->padding +
                                (ulong)(plVar5->nodetype == LYS_EXT) * 0x10 + -0x1c);
          }
          LVar11 = LYE_TOOMANY;
          goto LAB_0011ed0e;
        }
      }
    }
    base_type = (LY_DATA_TYPE)plVar5;
    if ((local_34 >> 0xb & 1) != 0) {
      plVar7 = node->schema;
      do {
        if ((plVar7->flags & 0x38) == 0x20) {
          pcVar15 = node_00->name;
          LVar11 = LYE_OBSDATA;
LAB_0011ecf9:
          ly_vlog(ctx,LVar11,LY_VLOG_LYD,node,pcVar15);
          return 1;
        }
        plVar7 = lys_parent(plVar7);
        base_type = (LY_DATA_TYPE)plVar5;
      } while ((plVar7 != (lys_node *)0x0) &&
              ((plVar7->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) ==
               LYS_UNKNOWN));
      if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        ppplVar8 = &node->schema[1].ext;
        while (pplVar2 = *ppplVar8, pplVar2 != (lys_ext_instance **)0x0) {
          if (((ulong)pplVar2[3] & 0x38) == 0x20) {
            pcVar15 = node_00->name;
            pcVar16 = (char *)*pplVar2;
            LVar11 = LYE_OBSTYPE;
LAB_0011ed0e:
            ly_vlog(ctx,LVar11,LY_VLOG_LYD,node,pcVar15,pcVar16);
            return 1;
          }
          ppplVar8 = (lys_ext_instance ***)(pplVar2 + 9);
        }
        if (*(int *)&node[1].schema == 7) {
          plVar6 = node->child;
          mod1 = node_00->module;
          iVar3 = lyp_check_status(node_00->flags,mod1,node_00->name,*(uint16_t *)&plVar6->next,
                                   *(lys_module **)&plVar6->hash,(char *)plVar6->schema,
                                   (lys_node *)0x0);
          base_type = (LY_DATA_TYPE)mod1;
          if (iVar3 != 0) {
            ly_vlog(ctx,LYE_PATH,LY_VLOG_LYD,node);
            return 1;
          }
        }
      }
    }
  }
  if ((node_00->flags & 0x2000) == 0) {
LAB_0011ea0a:
    local_48 = (lys_type *)0x0;
  }
  else {
    base_type = (LY_DATA_TYPE)node_00->ext_size;
    iVar3 = lyv_extension(node_00->ext,node_00->ext_size,node);
    if (iVar3 != 0) {
      return 1;
    }
    if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_0011ea0a;
    local_48 = (lys_type *)&node_00[1].ref;
    ppcVar12 = (char **)local_48;
    iVar3 = lyv_type_extension((lyd_node_leaf_list *)node,local_48,1);
    base_type = (LY_DATA_TYPE)ppcVar12;
    if (iVar3 != 0) {
      return 1;
    }
  }
  bVar9 = node->validity & 0xfb;
  node->validity = bVar9;
  LVar10 = node_00->nodetype;
LAB_0011ea21:
  if ((LVar10 & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
LAB_0011ea8c:
    if ((bVar9 & 2) != 0) {
      if ((local_34 >> 0xd & 1) == 0) {
        plVar6 = node;
        iVar3 = unres_data_add(unres,node,UNRES_UNIQ_LEAVES);
        base_type = (LY_DATA_TYPE)plVar6;
        if (iVar3 != 0) {
          return 1;
        }
      }
      else {
        node->validity = bVar9 & 0xfd;
      }
    }
    if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      iVar3 = *(int *)&node[1].schema;
      if (iVar3 == 7) {
        plVar5 = (lys_node *)node->child;
        local_50 = "Identity";
      }
      else {
        if (iVar3 != 6) {
          if (iVar3 == 2) {
            local_48 = find_orig_type((lys_type *)&node->schema[1].ref,base_type);
            local_50 = "Bit";
            LVar10 = LYS_UNKNOWN;
            goto LAB_0011eddd;
          }
          LVar10 = LYS_UNKNOWN;
          bVar9 = 0;
          goto LAB_0011ee0e;
        }
        plVar5 = (lys_node *)node->child;
        local_50 = "Enum";
      }
      plVar7 = (lys_node *)&node->ht;
      LVar10 = LYS_UNKNOWN;
LAB_0011edfc:
      local_68 = (lys_node *)plVar7->name;
      bVar9 = plVar5->iffeature_size;
      unaff_R15 = (lyd_node *)plVar5->iffeature;
LAB_0011ee0e:
      while (bVar9 != 0) {
        lVar14 = 0;
        while ((ulong)bVar9 * 0x20 + 0x20 != lVar14 + 0x20) {
          iVar3 = resolve_iffeature((lys_iffeature *)((long)&unaff_R15->schema + lVar14));
          lVar14 = lVar14 + 0x20;
          if (iVar3 == 0) {
            ly_vlog(ctx,LYE_INVAL,LY_VLOG_LYD,node,node->ht,node_00->name);
            ly_vlog(ctx,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "%s \"%s\" is disabled by its if-feature condition.",local_50,local_68);
            return 1;
          }
        }
        if (*(int *)&node[1].schema != 2) break;
        while( true ) {
          LVar10 = LVar10 + LYS_CONTAINER;
LAB_0011eddd:
          if ((local_48->info).bits.count <= LVar10) break;
          plVar5 = (&node->child->schema)[LVar10];
          plVar7 = plVar5;
          if (plVar5 != (lys_node *)0x0) goto LAB_0011edfc;
        }
        bVar9 = 0;
      }
    }
    if ((local_34 & 0x208e) == 0) {
      uVar4 = resolve_applies_must(node);
      if (((uVar4 & 1) != 0) && (iVar3 = unres_data_add(unres,node,UNRES_MUST), iVar3 != 0)) {
        return 1;
      }
      if (((uVar4 & 2) != 0) && (iVar3 = unres_data_add(unres,node,UNRES_MUST_INOUT), iVar3 != 0)) {
        return 1;
      }
    }
    return 0;
  }
  unaff_R15 = (lyd_node *)&node->child;
  plVar5 = (lys_node *)0x0;
  do {
    plVar7 = node_00;
    plVar5 = lys_getnext(plVar5,node_00,(lys_module *)0x0,0);
    base_type = (LY_DATA_TYPE)plVar7;
    if (plVar5 == (lys_node *)0x0) {
      bVar9 = node->validity;
      goto LAB_0011ea8c;
    }
    pplVar13 = (lyd_node **)unaff_R15;
    if ((plVar5->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
      while (plVar6 = *pplVar13, plVar6 != (lyd_node *)0x0) {
        if ((plVar6->schema == plVar5) && ((plVar6->validity & 1) != 0)) {
          if ((local_34 & 0x2006) == 0) {
            iVar3 = lyv_data_dup(plVar6,*(lyd_node **)unaff_R15);
            if (iVar3 != 0) {
              return 1;
            }
          }
          else {
            plVar6->validity = plVar6->validity & 0xfe;
          }
          break;
        }
        pplVar13 = &plVar6->next;
      }
    }
  } while( true );
}

Assistant:

int
lyv_data_content(struct lyd_node *node, int options, struct unres_data *unres)
{
    const struct lys_node *schema, *siter, *parent;
    struct lyd_node *diter, *start = NULL;
    struct lys_ident *ident;
    struct lys_tpdf *tpdf;
    struct lys_type *type = NULL;
    struct lyd_node_leaf_list *leaf;
    unsigned int i, j = 0;
    uint8_t iff_size;
    struct lys_iffeature *iff;
    const char *id, *idname;
    struct ly_ctx *ctx;

    assert(node);
    assert(node->schema);
    assert(unres);

    schema = node->schema; /* shortcut */
    ctx = schema->module->ctx;

    if (!(node->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        for (diter = node->parent; diter; diter = diter->parent) {
            if (diter->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                break;
            }
        }
        if (!diter && (options & (LYD_OPT_NOTIF | LYD_OPT_RPC))) {
            /* validating parent of a nested notification/action, skip most checks */
            options |= LYD_OPT_TRUSTED;
        }
    }

    if (node->validity & LYD_VAL_MAND) {
        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))) {
            /* check presence and correct order of all keys in case of list */
            if (schema->nodetype == LYS_LIST && !(options & (LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                if (lyv_keys(node)) {
                    return 1;
                }
            }

            if (schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_ANYDATA)) {
                /* check number of instances (similar to list uniqueness) for non-list nodes */

                /* find duplicity */
                start = lyd_first_sibling(node);
                for (diter = start; diter; diter = diter->next) {
                    if (diter->schema == schema && diter != node) {
                        parent = lys_parent(schema);
                        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, node, schema->name,
                               parent ? (parent->nodetype == LYS_EXT) ? ((struct lys_ext_instance *)parent)->arg_value : parent->name : "data tree");
                        return 1;
                    }
                }
            }

            if (options & LYD_OPT_OBSOLETE) {
                /* status - of the node's schema node itself and all its parents that
                * cannot have their own instance (like a choice statement) */
                siter = node->schema;
                do {
                    if (((siter->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) && (options & LYD_OPT_OBSOLETE)) {
                        LOGVAL(ctx, LYE_OBSDATA, LY_VLOG_LYD, node, schema->name);
                        return 1;
                    }
                    siter = lys_parent(siter);
                } while (siter && !(siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)));

                /* status of the identity value */
                if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                    if (options & LYD_OPT_OBSOLETE) {
                        /* check that we are not instantiating obsolete type */
                        tpdf = ((struct lys_node_leaf *)node->schema)->type.der;
                        while (tpdf) {
                            if ((tpdf->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) {
                                LOGVAL(ctx, LYE_OBSTYPE, LY_VLOG_LYD, node, schema->name, tpdf->name);
                                return 1;
                            }
                            tpdf = tpdf->type.der;
                        }
                    }
                    if (((struct lyd_node_leaf_list *)node)->value_type == LY_TYPE_IDENT) {
                        ident = ((struct lyd_node_leaf_list *)node)->value.ident;
                        if (lyp_check_status(schema->flags, schema->module, schema->name,
                                        ident->flags, ident->module, ident->name, NULL)) {
                            LOGPATH(ctx, LY_VLOG_LYD, node);
                            return 1;
                        }
                    }
                }
            }
        }

        /* check validation function for extension */
        if (schema->flags & LYS_VALID_EXT) {
            // check extension in node
            if (lyv_extension(schema->ext, schema->ext_size, node)) {
                return EXIT_FAILURE;
            }

            if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                type = &((struct lys_node_leaf *) schema)->type;
                leaf = (struct lyd_node_leaf_list *) node;
                if (lyv_type_extension(leaf, type, 1)) {
                    return EXIT_FAILURE;
                }
            }
        }

        /* remove the flag */
        node->validity &= ~LYD_VAL_MAND;
    }

    if (schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
        siter = NULL;
        while ((siter = lys_getnext(siter, schema, NULL, 0))) {
            if (siter->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
                LY_TREE_FOR(node->child, diter) {
                    if (diter->schema == siter && (diter->validity & LYD_VAL_DUP)) {
                        /* skip key uniqueness check in case of get/get-config data */
                        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                            if (lyv_data_dup(diter, node->child)) {
                                return 1;
                            }
                        } else {
                            /* always remove the flag */
                            diter->validity &= ~LYD_VAL_DUP;
                        }
                        /* all schema instances checked, continue with another schema node */
                        break;
                    }
                }
            }
        }
    }

    if (node->validity & LYD_VAL_UNIQUE) {
        if (options & LYD_OPT_TRUSTED) {
            /* just remove flag */
            node->validity &= ~LYD_VAL_UNIQUE;
        } else {
            /* check the unique constraint at the end (once the parsing is done) */
            if (unres_data_add(unres, node, UNRES_UNIQ_LEAVES)) {
                return 1;
            }
        }
    }

    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* since feature can be enabled/disabled, do this check despite the validity flag,
         * - check if the type value (enum, bit, identity) is disabled via feature  */
        leaf = (struct lyd_node_leaf_list *)node;
        switch (leaf->value_type) {
        case LY_TYPE_BITS:
            id = "Bit";
            /* get the count of bits */
            type = find_orig_type(&((struct lys_node_leaf *)leaf->schema)->type, LY_TYPE_BITS);
            for (j = iff_size = 0; j < type->info.bits.count; j++) {
                if (!leaf->value.bit[j]) {
                    continue;
                }
                idname = leaf->value.bit[j]->name;
                iff_size = leaf->value.bit[j]->iffeature_size;
                iff = leaf->value.bit[j]->iffeature;
                break;
nextbit:
                iff_size = 0;
            }
            break;
        case LY_TYPE_ENUM:
            id = "Enum";
            idname = leaf->value_str;
            iff_size = leaf->value.enm->iffeature_size;
            iff = leaf->value.enm->iffeature;
            break;
        case LY_TYPE_IDENT:
            id = "Identity";
            idname = leaf->value_str;
            iff_size = leaf->value.ident->iffeature_size;
            iff = leaf->value.ident->iffeature;
            break;
        default:
            iff_size = 0;
            break;
        }

        if (iff_size) {
            for (i = 0; i < iff_size; i++) {
                if (!resolve_iffeature(&iff[i])) {
                    LOGVAL(ctx, LYE_INVAL, LY_VLOG_LYD, node, leaf->value_str, schema->name);
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "%s \"%s\" is disabled by its if-feature condition.",
                           id, idname);
                    return 1;
                }
            }
            if (leaf->value_type == LY_TYPE_BITS) {
                goto nextbit;
            }
        }
    }

    /* check must conditions */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
        i = resolve_applies_must(node);
        if ((i & 0x1) && unres_data_add(unres, node, UNRES_MUST)) {
            return 1;
        }
        if ((i & 0x2) && unres_data_add(unres, node, UNRES_MUST_INOUT)) {
            return 1;
        }
    }

    return 0;
}